

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::ProcessDef(BackwardPass *this,Opnd *opnd)

{
  BasicBlock *pBVar1;
  Instr *this_00;
  GlobOpt *this_01;
  Region *region;
  StackSym **ppSVar2;
  BVSparse<Memory::JitArenaAllocator> *this_02;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BOOLEAN BVar6;
  bool bVar7;
  RegSlot RVar8;
  BailOutKind BVar9;
  BailOutKind BVar10;
  SymOpnd *pSVar11;
  PropertySym *pPVar12;
  PropertySymOpnd *pPVar13;
  undefined4 *puVar14;
  Func *pFVar15;
  StackSym *pSVar16;
  Opnd *pOVar17;
  RegOpnd *pRVar18;
  bool local_79;
  BailOutKind bailOutKind;
  bool hasSideEffects;
  StackSym *varSym;
  BOOLEAN isPropertySymUsed;
  PropertySym *propertySym;
  Instr *instr;
  BOOLEAN keepVarSymLiveForException;
  BOOLEAN keepSymLiveForException;
  BOOLEAN isUsed;
  BasicBlock *block;
  StackSym *pSStack_30;
  bool firstDef;
  Sym *sym;
  BOOLEAN isJITOptimizedReg;
  Opnd *opnd_local;
  BackwardPass *this_local;
  
  bVar4 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar4) {
    pRVar18 = IR::Opnd::AsRegOpnd(opnd);
    pSStack_30 = pRVar18->m_sym;
    sym._7_1_ = IR::Opnd::GetIsJITOptimizedReg(opnd);
    bVar4 = IsCollectionPass(this);
    if (((!bVar4) && (InvalidateCloneStrCandidate(this,opnd), this->tag == BackwardPhase)) &&
       (bVar4 = IsPrePass(this), bVar4)) {
      BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        (this->currentPrePassLoop->symsAssignedToInLoop,(pSStack_30->super_Sym).m_id
                        );
      if (BVar6 == '\0') {
        bVar4 = InstrPreservesNumberValues(this,this->currentInstr,&pSStack_30->super_Sym);
        if (bVar4) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentPrePassLoop->preservesNumberValue,(pSStack_30->super_Sym).m_id);
        }
      }
      else {
        bVar4 = InstrPreservesNumberValues(this,this->currentInstr,&pSStack_30->super_Sym);
        if (!bVar4) {
          BVSparse<Memory::JitArenaAllocator>::Clear
                    (this->currentPrePassLoop->preservesNumberValue,(pSStack_30->super_Sym).m_id);
        }
      }
    }
  }
  else {
    bVar4 = IR::Opnd::IsSymOpnd(opnd);
    if (!bVar4) {
      bVar4 = IR::Opnd::IsIndirOpnd(opnd);
      if (bVar4) {
        ProcessUse(this,opnd);
      }
      return false;
    }
    pSVar11 = IR::Opnd::AsSymOpnd(opnd);
    pSStack_30 = (StackSym *)pSVar11->m_sym;
    sym._7_1_ = IR::Opnd::GetIsJITOptimizedReg(opnd);
  }
  pBVar1 = this->currentBlock;
  instr._7_1_ = true;
  instr._6_1_ = false;
  instr._5_1_ = false;
  this_00 = this->currentInstr;
  bVar4 = IR::Instr::IsByteCodeUsesInstr(this_00);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1e81,"(!instr->IsByteCodeUsesInstr())","!instr->IsByteCodeUsesInstr()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
  }
  bVar4 = Sym::IsPropertySym(&pSStack_30->super_Sym);
  if (bVar4) {
    pPVar12 = Sym::AsPropertySym(&pSStack_30->super_Sym);
    ProcessStackSymUse(this,pPVar12->m_stackSym,sym._7_1_);
    bVar4 = IsCollectionPass(this);
    if (bVar4) {
      return false;
    }
    bVar4 = DoDeadStoreSlots(this);
    if ((bVar4) &&
       (((pPVar12->super_Sym).field_0x15 == '\x02' || ((pPVar12->super_Sym).field_0x15 == '\x01'))))
    {
      BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        (pBVar1->slotDeadStoreCandidates,(pPVar12->super_Sym).m_id);
      if ((BVar6 != '\0') &&
         (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar1->upwardExposedUses,(pPVar12->super_Sym).m_id), BVar5 != '\0')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1e91,
                           "(isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id))"
                           ,
                           "isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id)"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 0;
      }
      local_79 = true;
      if (BVar6 != '\0') {
        BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                          (pBVar1->upwardExposedUses,(pPVar12->m_stackSym->super_Sym).m_id);
        local_79 = BVar6 != '\0';
      }
      instr._7_1_ = local_79;
    }
    BVar6 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (pBVar1->upwardExposedFields,(pPVar12->super_Sym).m_id);
    DoSetDead(this,opnd,(bool)((BVar6 != '\0' ^ 0xffU) & 1));
    if (this->tag == BackwardPhase) {
      pSVar11 = IR::Opnd::AsSymOpnd(opnd);
      bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar11);
      if (bVar4) {
        this_01 = this->globOpt;
        pPVar13 = IR::Opnd::AsPropertySymOpnd(opnd);
        GlobOpt::PreparePropertySymOpndForTypeCheckSeq
                  (this_01,pPVar13,this_00,this->currentBlock->loop);
      }
    }
    pSVar11 = IR::Opnd::AsSymOpnd(opnd);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar11);
    if (bVar4) {
      pPVar13 = IR::Opnd::AsPropertySymOpnd(opnd);
      ProcessPropertySymOpndUse(this,pPVar13);
    }
  }
  else {
    bVar4 = IR::Instr::IsByteCodeUsesInstr(this_00);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar14 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1ea7,"(!instr->IsByteCodeUsesInstr())","!instr->IsByteCodeUsesInstr()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar14 = 0;
    }
    bVar4 = DoByteCodeUpwardExposedUsed(this);
    if (bVar4) {
      pSVar16 = Sym::AsStackSym(&pSStack_30->super_Sym);
      bVar4 = StackSym::HasByteCodeRegSlot(pSVar16);
      if (bVar4) {
        _bailOutKind = Sym::AsStackSym(&pSStack_30->super_Sym);
        bVar4 = StackSym::IsTypeSpec(_bailOutKind);
        if (bVar4) {
          _bailOutKind = StackSym::GetVarEquivSym(_bailOutKind,(Func *)0x0);
        }
        if (this->currentRegion != (Region *)0x0) {
          region = this->currentRegion;
          pSVar16 = Sym::AsStackSym(&pSStack_30->super_Sym);
          instr._6_1_ = CheckWriteThroughSymInRegion(this,region,pSVar16);
          instr._5_1_ = CheckWriteThroughSymInRegion(this,this->currentRegion,_bailOutKind);
        }
        if (sym._7_1_ == false) {
          pFVar15 = this->func;
          pSVar16 = Sym::AsStackSym(&pSStack_30->super_Sym);
          bVar4 = DoDeadStore(pFVar15,pSVar16);
          if ((!bVar4) && (bVar4 = IR::Opnd::IsRegOpnd(opnd), bVar4)) {
            pRVar18 = IR::Opnd::AsRegOpnd(opnd);
            pRVar18->field_0x18 = pRVar18->field_0x18 & 0xfb | 4;
          }
          if (instr._5_1_ == false) {
            BVSparse<Memory::JitArenaAllocator>::Clear
                      (pBVar1->byteCodeUpwardExposedUsed,(_bailOutKind->super_Sym).m_id);
            pFVar15 = StackSym::GetByteCodeFunc(_bailOutKind);
            if (pFVar15 == this->func) {
              ppSVar2 = pBVar1->byteCodeRestoreSyms;
              RVar8 = StackSym::GetByteCodeRegSlot(_bailOutKind);
              ppSVar2[RVar8] = (StackSym *)0x0;
            }
          }
        }
      }
    }
    bVar4 = IsCollectionPass(this);
    if (bVar4) {
      return false;
    }
    bVar4 = IR::Opnd::IsRegOpnd(opnd);
    if (bVar4) {
      pSVar16 = Sym::AsStackSym(&pSStack_30->super_Sym);
      MarkTemp(this,pSVar16);
    }
    if ((this->tag == BackwardPhase) && (this_00->m_opcode == Ld_A)) {
      pOVar17 = IR::Instr::GetSrc1(this_00);
      bVar4 = IR::Opnd::IsRegOpnd(pOVar17);
      if ((bVar4) &&
         (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                            (pBVar1->upwardExposedFields,(pSStack_30->super_Sym).m_id),
         BVar6 != '\0')) {
        this_02 = pBVar1->upwardExposedFields;
        pOVar17 = IR::Instr::GetSrc1(this_00);
        pRVar18 = IR::Opnd::AsRegOpnd(pOVar17);
        BVSparse<Memory::JitArenaAllocator>::Set(this_02,(pRVar18->m_sym->super_Sym).m_id);
      }
    }
    if (instr._6_1_ == false) {
      instr._7_1_ = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                              (pBVar1->upwardExposedUses,(pSStack_30->super_Sym).m_id);
    }
  }
  if ((instr._7_1_ == '\0') && (bVar4 = DoDeadStore(this), bVar4)) {
    bVar7 = IR::Instr::HasAnySideEffects(this_00);
    bVar4 = false;
    if ((((bVar7) && (bVar4 = false, this_00->m_opcode != StFld)) &&
        (bVar4 = false, this_00->m_opcode != StRootFld)) &&
       (bVar4 = false, this_00->m_opcode != StFldStrict)) {
      bVar4 = this_00->m_opcode != StRootFldStrict;
    }
    bVar7 = IsPrePass(this);
    if ((bVar7) || (bVar4)) {
      this_local._7_1_ = false;
    }
    else {
      bVar4 = IR::Opnd::IsRegOpnd(opnd);
      if ((bVar4) &&
         (pRVar18 = IR::Opnd::AsRegOpnd(opnd), ((byte)pRVar18->field_0x18 >> 2 & 1) != 0)) {
        this_local._7_1_ = false;
      }
      else {
        bVar4 = IR::Instr::HasBailOutInfo(this_00);
        if (bVar4) {
          BVar9 = IR::Instr::GetBailOutKind(this_00);
          BVar10 = IR::operator&(BVar9,BailOutOnResultConditions);
          if (BVar10 != BailOutInvalid) {
            return false;
          }
          BVar10 = IR::operator~(BailOutKindBits);
          BVar9 = IR::operator&(BVar9,BVar10);
          if ((((BVar9 - BailOutIntOnly < 3) || (BVar9 == BailOutOnNotPrimitive)) ||
              (BVar9 - BailOutExpectingInteger < 3)) || (BVar9 - BailOutOnFloor < 4)) {
            return false;
          }
        }
        DeadStoreInstr(this,this_00);
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::ProcessDef(IR::Opnd * opnd)
{
    BOOLEAN isJITOptimizedReg = false;
    Sym * sym;
    if (opnd->IsRegOpnd())
    {
        sym = opnd->AsRegOpnd()->m_sym;
        isJITOptimizedReg = opnd->GetIsJITOptimizedReg();
        if (!IsCollectionPass())
        {
            this->InvalidateCloneStrCandidate(opnd);
            if ((tag == Js::BackwardPhase) && IsPrePass())
            {
                bool firstDef = !this->currentPrePassLoop->symsAssignedToInLoop->TestAndSet(sym->m_id);

                if (firstDef)
                {
                    if (this->InstrPreservesNumberValues(this->currentInstr, sym))
                    {
                        this->currentPrePassLoop->preservesNumberValue->Set(sym->m_id);
                    }
                }
                else if (!this->InstrPreservesNumberValues(this->currentInstr, sym))
                {
                    this->currentPrePassLoop->preservesNumberValue->Clear(sym->m_id);
                }
            }
        }
    }
    else if (opnd->IsSymOpnd())
    {
        sym = opnd->AsSymOpnd()->m_sym;
        isJITOptimizedReg = opnd->GetIsJITOptimizedReg();
    }
    else
    {
        if (opnd->IsIndirOpnd())
        {
            this->ProcessUse(opnd);
        }
        return false;
    }

    BasicBlock * block = this->currentBlock;
    BOOLEAN isUsed = true;
    BOOLEAN keepSymLiveForException = false;
    BOOLEAN keepVarSymLiveForException = false;
    IR::Instr * instr = this->currentInstr;
    Assert(!instr->IsByteCodeUsesInstr());
    if (sym->IsPropertySym())
    {
        PropertySym *propertySym = sym->AsPropertySym();
        ProcessStackSymUse(propertySym->m_stackSym, isJITOptimizedReg);

        if (IsCollectionPass())
        {
            return false;
        }

        if (this->DoDeadStoreSlots())
        {
            if (propertySym->m_fieldKind == PropertyKindLocalSlots || propertySym->m_fieldKind == PropertyKindSlots)
            {
                BOOLEAN isPropertySymUsed = !block->slotDeadStoreCandidates->TestAndSet(propertySym->m_id);
                Assert(isPropertySymUsed || !block->upwardExposedUses->Test(propertySym->m_id));

                isUsed = isPropertySymUsed || block->upwardExposedUses->Test(propertySym->m_stackSym->m_id);
            }
        }

        this->DoSetDead(opnd, !block->upwardExposedFields->TestAndClear(propertySym->m_id));

        if (tag == Js::BackwardPhase)
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->globOpt->PreparePropertySymOpndForTypeCheckSeq(opnd->AsPropertySymOpnd(), instr, this->currentBlock->loop);
            }
        }
        if (opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            this->ProcessPropertySymOpndUse(opnd->AsPropertySymOpnd());
        }
    }
    else
    {
        Assert(!instr->IsByteCodeUsesInstr());

        if (this->DoByteCodeUpwardExposedUsed())
        {
            if (sym->AsStackSym()->HasByteCodeRegSlot())
            {
                StackSym * varSym = sym->AsStackSym();
                if (varSym->IsTypeSpec())
                {
                    // It has to have a var version for byte code regs
                    varSym = varSym->GetVarEquivSym(nullptr);
                }

                if (this->currentRegion)
                {
                    keepSymLiveForException = this->CheckWriteThroughSymInRegion(this->currentRegion, sym->AsStackSym());
                    keepVarSymLiveForException = this->CheckWriteThroughSymInRegion(this->currentRegion, varSym);
                }

                if (!isJITOptimizedReg)
                {
                    if (!DoDeadStore(this->func, sym->AsStackSym()))
                    {
                        // Don't deadstore the bytecodereg sym, so that we could do write to get the locals inspection
                        if (opnd->IsRegOpnd())
                        {
                            opnd->AsRegOpnd()->m_dontDeadStore = true;
                        }
                    }

                    // write through symbols should not be cleared from the byteCodeUpwardExposedUsed BV upon defs in the Try region:
                    //      try
                    //          x =
                    //          <bailout> <-- this bailout should restore x from its first def. This would not happen if x is cleared
                    //                        from byteCodeUpwardExposedUsed when we process its second def
                    //          <exception>
                    //          x =
                    //      catch
                    //          = x
                    if (!keepVarSymLiveForException)
                    {
                        // Always track the sym use on the var sym.
                        block->byteCodeUpwardExposedUsed->Clear(varSym->m_id);
#if DBG
                        // TODO: We can only track first level function stack syms right now
                        if (varSym->GetByteCodeFunc() == this->func)
                        {
                            block->byteCodeRestoreSyms[varSym->GetByteCodeRegSlot()] = nullptr;
                        }
#endif
                    }
                }
            }
        }

        if (IsCollectionPass())
        {
            return false;
        }

        // Don't care about property sym for mark temps
        if (opnd->IsRegOpnd())
        {
            this->MarkTemp(sym->AsStackSym());
        }

        if (this->tag == Js::BackwardPhase &&
            instr->m_opcode == Js::OpCode::Ld_A &&
            instr->GetSrc1()->IsRegOpnd() &&
            block->upwardExposedFields->Test(sym->m_id))
        {
            block->upwardExposedFields->Set(instr->GetSrc1()->AsRegOpnd()->m_sym->m_id);
        }

        if (!keepSymLiveForException)
        {
            isUsed = block->upwardExposedUses->TestAndClear(sym->m_id);
        }
    }

    if (isUsed || !this->DoDeadStore())
    {
        return false;
    }

    // FromVar on a primitive value has no side-effects
    // TODO: There may be more cases where FromVars can be dead-stored, such as cases where they have a bailout that would bail
    // out on non-primitive vars, thereby causing no side effects anyway. However, it needs to be ensured that no assumptions
    // that depend on the bailout are made later in the function.

    // Special case StFld for trackable fields
    bool hasSideEffects = instr->HasAnySideEffects()
        && instr->m_opcode != Js::OpCode::StFld
        && instr->m_opcode != Js::OpCode::StRootFld
        && instr->m_opcode != Js::OpCode::StFldStrict
        && instr->m_opcode != Js::OpCode::StRootFldStrict;

    if (this->IsPrePass() || hasSideEffects)
    {
        return false;
    }

    if (opnd->IsRegOpnd() && opnd->AsRegOpnd()->m_dontDeadStore)
    {
        return false;
    }

    if (instr->HasBailOutInfo())
    {
        // A bailout inserted for aggressive or lossy int type specialization causes assumptions to be made on the value of
        // the instruction's destination later on, as though the bailout did not happen. If the value is an int constant and
        // that value is propagated forward, it can cause the bailout instruction to become a dead store and be removed,
        // thereby invalidating the assumptions made. Or for lossy int type specialization, the lossy conversion to int32
        // may have side effects and so cannot be dead-store-removed. As one way of solving that problem, bailout
        // instructions resulting from aggressive or lossy int type spec are not dead-stored.
        const auto bailOutKind = instr->GetBailOutKind();
        if(bailOutKind & IR::BailOutOnResultConditions)
        {
            return false;
        }
        switch(bailOutKind & ~IR::BailOutKindBits)
        {
            case IR::BailOutIntOnly:
            case IR::BailOutNumberOnly:
            case IR::BailOutExpectingInteger:
            case IR::BailOutPrimitiveButString:
            case IR::BailOutExpectingString:
            case IR::BailOutOnNotPrimitive:
            case IR::BailOutFailedInlineTypeCheck:
            case IR::BailOutOnFloor:
            case IR::BailOnModByPowerOf2:
            case IR::BailOnDivResultNotInt:
            case IR::BailOnIntMin:
                return false;
        }
    }

    // Dead store
    DeadStoreInstr(instr);
    return true;
}